

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true> __thiscall
duckdb::SampleOptions::Deserialize(SampleOptions *this,Deserializer *deserializer)

{
  bool bVar1;
  SampleMethod SVar2;
  long seed_;
  SampleOptions *this_00;
  pointer pSVar3;
  Value sample_size;
  
  Deserializer::ReadProperty<duckdb::Value>(&sample_size,deserializer,100,"sample_size");
  bVar1 = Deserializer::ReadPropertyWithDefault<bool>(deserializer,0x65,"is_percentage");
  SVar2 = Deserializer::ReadProperty<duckdb::SampleMethod>(deserializer,0x66,"method");
  seed_ = Deserializer::ReadPropertyWithDefault<long>(deserializer,0x67,"seed");
  this_00 = (SampleOptions *)operator_new(0x58);
  SampleOptions(this_00,seed_);
  *(SampleOptions **)&(this->sample_size).type_ = this_00;
  pSVar3 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
           operator->((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
                       *)this);
  Value::operator=(&pSVar3->sample_size,&sample_size);
  pSVar3 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
           operator->((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
                       *)this);
  pSVar3->is_percentage = bVar1;
  pSVar3 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
           operator->((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
                       *)this);
  pSVar3->method = SVar2;
  Value::~Value(&sample_size);
  return (unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>)
         (unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>)this;
}

Assistant:

unique_ptr<SampleOptions> SampleOptions::Deserialize(Deserializer &deserializer) {
	auto sample_size = deserializer.ReadProperty<Value>(100, "sample_size");
	auto is_percentage = deserializer.ReadPropertyWithDefault<bool>(101, "is_percentage");
	auto method = deserializer.ReadProperty<SampleMethod>(102, "method");
	auto seed = deserializer.ReadPropertyWithDefault<int64_t>(103, "seed");
	auto result = duckdb::unique_ptr<SampleOptions>(new SampleOptions(seed));
	result->sample_size = sample_size;
	result->is_percentage = is_percentage;
	result->method = method;
	return result;
}